

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O0

bool anon_unknown.dwarf_67a627::InitializeStageSymbolTable
               (TBuiltInParseables *builtInParseables,int version,EProfile profile,
               SpvVersion *spvVersion,EShLanguage language,EShSource source,TInfoSink *infoSink,
               TSymbolTable **commonTable,TSymbolTable **symbolTables)

{
  TSymbolTable *this;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  EShSource source_local;
  EShLanguage language_local;
  SpvVersion *spvVersion_local;
  EProfile profile_local;
  int version_local;
  TBuiltInParseables *builtInParseables_local;
  
  this = symbolTables[language];
  iVar2 = CommonIndex(profile,language);
  glslang::TSymbolTable::adoptLevels(this,commonTable[iVar2]);
  iVar2 = (*builtInParseables->_vptr_TBuiltInParseables[5])(builtInParseables,(ulong)language);
  bVar1 = InitializeSymbolTable
                    ((TString *)CONCAT44(extraout_var,iVar2),version,profile,spvVersion,language,
                     source,infoSink,symbolTables[language]);
  if (bVar1) {
    (*builtInParseables->_vptr_TBuiltInParseables[6])
              (builtInParseables,(ulong)(uint)version,(ulong)profile,spvVersion,(ulong)language,
               symbolTables[language]);
    if ((profile == EEsProfile) && (299 < version)) {
      glslang::TSymbolTable::setNoBuiltInRedeclarations(symbolTables[language]);
    }
    if (version == 0x6e) {
      glslang::TSymbolTable::setSeparateNameSpaces(symbolTables[language]);
    }
    builtInParseables_local._7_1_ = true;
  }
  else {
    builtInParseables_local._7_1_ = false;
  }
  return builtInParseables_local._7_1_;
}

Assistant:

bool InitializeStageSymbolTable(TBuiltInParseables& builtInParseables, int version, EProfile profile, const SpvVersion& spvVersion,
                                EShLanguage language, EShSource source, TInfoSink& infoSink, TSymbolTable** commonTable,
                                TSymbolTable** symbolTables)
{
    (*symbolTables[language]).adoptLevels(*commonTable[CommonIndex(profile, language)]);
    if (!InitializeSymbolTable(builtInParseables.getStageString(language), version, profile, spvVersion, language, source,
                          infoSink, *symbolTables[language]))
        return false;
    builtInParseables.identifyBuiltIns(version, profile, spvVersion, language, *symbolTables[language]);
    if (profile == EEsProfile && version >= 300)
        (*symbolTables[language]).setNoBuiltInRedeclarations();
    if (version == 110)
        (*symbolTables[language]).setSeparateNameSpaces();

    return true;
}